

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::mrg5>(mrg5 *r)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  string res;
  string local_58;
  double local_38;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  iVar4 = 0;
  lVar11 = 0x1000000;
  iVar6 = (r->S).r[0];
  iVar5 = (r->S).r[1];
  iVar10 = (r->S).r[2];
  iVar7 = (r->S).r[3];
  iVar9 = (r->S).r[4];
  do {
    iVar8 = iVar7;
    iVar7 = iVar10;
    iVar10 = iVar5;
    iVar5 = iVar6;
    uVar2 = (long)iVar8 * (long)(r->P).a[3] + (long)iVar7 * (long)(r->P).a[2] +
            (long)iVar10 * (long)(r->P).a[1] + (long)iVar5 * (long)(r->P).a[0];
    uVar3 = uVar2 + 0x80000001fffffffe;
    if (uVar2 < 0x7ffffffe00000002) {
      uVar3 = uVar2;
    }
    uVar3 = (long)iVar9 * (long)(r->P).a[4] + uVar3;
    uVar2 = (uVar3 >> 0x1f) + (uVar3 & 0x7fffffff);
    uVar3 = uVar2 - 0x1fffffffc;
    if ((uint)(uVar2 >> 2) < 0x7fffffff) {
      uVar3 = uVar2;
    }
    uVar2 = uVar3 - 0xfffffffe;
    if (uVar3 < 0xfffffffe) {
      uVar2 = uVar3;
    }
    iVar6 = (int)uVar2 + -0x7fffffff;
    if (uVar2 < 0x7fffffff) {
      iVar6 = (int)uVar2;
    }
    iVar4 = iVar4 + iVar6;
    lVar11 = lVar11 + -1;
    iVar9 = iVar8;
  } while (lVar11 != 0);
  (r->S).r[0] = iVar6;
  (r->S).r[1] = iVar5;
  (r->S).r[2] = iVar10;
  (r->S).r[3] = iVar7;
  (r->S).r[4] = iVar8;
  lVar11 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar11 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}